

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigTests.cpp
# Opt level: O0

EGLint deqp::egl::ChooseConfigRandomCase::getSurfaceType(Random *rnd)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  EGLint bits;
  Random *rnd_local;
  
  bVar1 = de::Random::getBool(rnd);
  uVar2 = 0;
  if (bVar1) {
    uVar2 = 4;
  }
  bVar1 = de::Random::getBool(rnd);
  uVar3 = 0;
  if (bVar1) {
    uVar3 = 2;
  }
  bVar1 = de::Random::getBool(rnd);
  return (uint)bVar1 | uVar3 | uVar2;
}

Assistant:

static EGLint getSurfaceType (de::Random& rnd)
	{
		EGLint bits = 0;
		bits |= rnd.getBool() ? EGL_WINDOW_BIT	: 0;
		bits |= rnd.getBool() ? EGL_PIXMAP_BIT	: 0;
		bits |= rnd.getBool() ? EGL_PBUFFER_BIT	: 0;
		return bits;
	}